

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_anyNotEqual_bvec4(ShaderEvalContext *c)

{
  float fVar1;
  bool bVar2;
  int i;
  long lVar3;
  bool bVar4;
  Vector<bool,_4> res_1;
  Vector<bool,_4> res;
  float local_48 [4];
  undefined8 local_38;
  float local_30;
  float local_2c;
  float local_28 [10];
  
  local_38 = *(undefined8 *)(c->in[0].m_data + 1);
  local_30 = c->in[0].m_data[3];
  local_2c = c->in[0].m_data[0];
  local_28[4] = 0.0;
  local_28[5] = 0.0;
  local_28[6] = 0.0;
  local_28[7] = 0.0;
  res.m_data[0] = false;
  res.m_data[1] = false;
  res.m_data[2] = false;
  res.m_data[3] = false;
  lVar3 = 0;
  do {
    fVar1 = *(float *)((long)&local_38 + lVar3 * 4);
    res.m_data[lVar3] = local_28[lVar3 + 4] <= fVar1 && fVar1 != local_28[lVar3 + 4];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_48[0] = c->in[1].m_data[3];
  local_48[1] = c->in[1].m_data[2];
  local_48[2] = c->in[1].m_data[1];
  local_48[3] = c->in[1].m_data[0];
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  local_28[3] = 0.0;
  res_1.m_data[0] = false;
  res_1.m_data[1] = false;
  res_1.m_data[2] = false;
  res_1.m_data[3] = false;
  lVar3 = 0;
  do {
    res_1.m_data[lVar3] = local_28[lVar3] <= local_48[lVar3] && local_48[lVar3] != local_28[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  lVar3 = 0;
  bVar4 = false;
  do {
    bVar2 = !bVar4;
    bVar4 = true;
    if (bVar2) {
      bVar4 = res.m_data[lVar3] != res_1.m_data[lVar3];
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  (c->color).m_data[0] = (float)bVar4;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }